

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Hes_Emu::start_track_(Hes_Emu *this,int track)

{
  uint8_t in_SIL;
  Hes_Emu *in_RDI;
  uint i;
  blargg_err_t blargg_return_err_;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar1;
  Hes_Cpu *local_8;
  
  local_8 = (Hes_Cpu *)
            Classic_Emu::start_track_
                      ((Classic_Emu *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (int)((ulong)in_RDI >> 0x20));
  if (local_8 == (Hes_Cpu *)0x0) {
    memset(&in_RDI->super_Hes_Cpu,0,0x2000);
    memset(in_RDI->sgx,0,0x6008);
    Hes_Apu::reset((Hes_Apu *)in_RDI);
    Hes_Cpu::reset((Hes_Cpu *)0x95b9c5);
    for (uVar1 = 0; uVar1 < 8; uVar1 = uVar1 + 1) {
      Hes_Cpu::set_mmr(local_8,uVar1,in_stack_ffffffffffffffd8);
    }
    Hes_Cpu::set_mmr(local_8,uVar1,in_stack_ffffffffffffffd8);
    (in_RDI->irq).disables = '\x06';
    (in_RDI->irq).timer = 0x40000000;
    (in_RDI->irq).vdp = 0x40000000;
    (in_RDI->timer).enabled = '\0';
    (in_RDI->timer).raw_load = 0x80;
    (in_RDI->timer).count = (in_RDI->timer).load;
    (in_RDI->timer).fired = '\0';
    (in_RDI->timer).last_time = 0;
    (in_RDI->vdp).latch = '\0';
    (in_RDI->vdp).control = '\0';
    (in_RDI->vdp).next_vbl = 0;
    (in_RDI->super_Hes_Cpu).ram[0x1ff] = '\x1f';
    (in_RDI->super_Hes_Cpu).ram[0x1fe] = 0xfe;
    (in_RDI->super_Hes_Cpu).r.sp = 0xfd;
    uVar1 = get_le16((in_RDI->header_).init_addr);
    (in_RDI->super_Hes_Cpu).r.pc = (uint16_t)uVar1;
    (in_RDI->super_Hes_Cpu).r.a = in_SIL;
    recalc_timer_load(in_RDI);
    in_RDI->last_frame_hook = 0;
    local_8 = (Hes_Cpu *)0x0;
  }
  return (blargg_err_t)local_8;
}

Assistant:

blargg_err_t Hes_Emu::start_track_( int track )
{
	RETURN_ERR( Classic_Emu::start_track_( track ) );
	
	memset( ram, 0, sizeof ram ); // some HES music relies on zero fill
	memset( sgx, 0, sizeof sgx );
	
	apu.reset();
	cpu::reset();
	
	for ( unsigned i = 0; i < sizeof header_.banks; i++ )
		set_mmr( i, header_.banks [i] );
	set_mmr( page_count, 0xFF ); // unmapped beyond end of address space
	
	irq.disables  = timer_mask | vdp_mask;
	irq.timer     = future_hes_time;
	irq.vdp       = future_hes_time;
	
	timer.enabled = false;
	timer.raw_load= 0x80;
	timer.count   = timer.load;
	timer.fired   = false;
	timer.last_time = 0;
	
	vdp.latch     = 0;
	vdp.control   = 0;
	vdp.next_vbl  = 0;
	
	ram [0x1FF] = (idle_addr - 1) >> 8;
	ram [0x1FE] = (idle_addr - 1) & 0xFF;
	r.sp = 0xFD;
	r.pc = get_le16( header_.init_addr );
	r.a  = track;
	
	recalc_timer_load();
	last_frame_hook = 0;
	
	return 0;
}